

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel.cpp
# Opt level: O0

int64_t primecount::pi_lmo_parallel(int64_t x,int threads,bool is_print)

{
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  size_t sVar1;
  long y_00;
  int64_t c_00;
  int64_t iVar2;
  Vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  byte in_DL;
  long in_RDI;
  int64_t sum;
  int64_t phi;
  int64_t s2;
  int64_t s2_approx;
  int64_t s1;
  int64_t p2;
  int64_t pi_y;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  type primes;
  int64_t c;
  int64_t z;
  int64_t y;
  int64_t x13;
  double alpha;
  undefined1 in_stack_000004a7;
  Vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000004a8;
  int64_t in_stack_000004b0;
  int64_t in_stack_000004b8;
  int64_t in_stack_000004c0;
  int64_t in_stack_000004c8;
  int64_t in_stack_000004d0;
  Vector<int,_std::allocator<int>_> *in_stack_000004e0;
  Vector<int,_std::allocator<int>_> *in_stack_000004e8;
  int in_stack_000004f0;
  uint64_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int64_t in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffee0;
  int threads_00;
  int64_t in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 is_print_00;
  undefined4 uVar3;
  int in_stack_fffffffffffffefc;
  undefined4 uVar4;
  int64_t in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff10;
  Vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  long local_98;
  long local_90;
  uint64_t local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_30;
  double local_20;
  byte local_15;
  long local_10;
  long local_8;
  
  threads_00 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_15 = in_DL & 1;
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    local_30 = in_RDI >> 0x3f;
    x_00._8_4_ = in_stack_fffffffffffffef8;
    x_00._0_8_ = in_stack_fffffffffffffef0;
    x_00._12_4_ = in_stack_fffffffffffffefc;
    local_10 = in_RDI;
    local_20 = get_alpha_lmo((maxint_t)x_00);
    local_40 = (anonymous_namespace)::iroot<3,long>
                         (CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_48 = (long)((double)local_40 * local_20);
    local_50 = local_10 / local_48;
    local_58 = PhiTiny::get_c(in_stack_fffffffffffffe98);
    if ((local_15 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      str._M_len._4_4_ = in_stack_fffffffffffffeac;
      str._M_len._0_4_ = in_stack_fffffffffffffea8;
      str._M_str._0_4_ = in_stack_fffffffffffffeb0;
      str._M_str._4_4_ = in_stack_fffffffffffffeb4;
      print(str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      str_00._M_len._4_4_ = in_stack_fffffffffffffeac;
      str_00._M_len._0_4_ = in_stack_fffffffffffffea8;
      str_00._M_str._0_4_ = in_stack_fffffffffffffeb0;
      str_00._M_str._4_4_ = in_stack_fffffffffffffeb4;
      print(str_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      str_01._M_len._4_4_ = in_stack_fffffffffffffeac;
      str_01._M_len._0_4_ = in_stack_fffffffffffffea8;
      str_01._M_str._0_4_ = in_stack_fffffffffffffeb0;
      str_01._M_str._4_4_ = in_stack_fffffffffffffeb4;
      print(str_01);
      local_90 = local_10 >> 0x3f;
      local_98 = local_10;
      x_01._8_8_ = in_stack_ffffffffffffff08;
      x_01._0_8_ = in_stack_ffffffffffffff00;
      print((maxint_t)x_01,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,threads_00);
    }
    generate_primes<unsigned_int>(in_stack_fffffffffffffe98);
    generate_lpf(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    generate_moebius(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    is_print_00 = (undefined1)((uint)in_stack_fffffffffffffef8 >> 0x18);
    sVar1 = Vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b0);
    y_00 = sVar1 - 1;
    c_00 = P2(in_stack_ffffffffffffff10,y_00,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
              (bool)is_print_00);
    iVar2 = S1(in_stack_ffffffffffffff10,y_00,c_00,in_stack_fffffffffffffefc,(bool)is_print_00);
    uVar3 = (undefined4)iVar2;
    uVar4 = (undefined4)((ulong)iVar2 >> 0x20);
    anon_unknown.dwarf_80202::S2_approx<long>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    this = (Vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           anon_unknown.dwarf_80202::S2
                     (in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004b8,
                      in_stack_000004b0,in_stack_000004a8,in_stack_000004e0,in_stack_000004e8,
                      in_stack_000004f0,(bool)in_stack_000004a7);
    local_8 = (long)this + ((y_00 + CONCAT44(uVar4,uVar3) + -1) - c_00);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)this);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)this);
    Vector<unsigned_int,_std::allocator<unsigned_int>_>::~Vector(this);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo_parallel(int64_t x,
                        int threads,
                        bool is_print)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo_parallel(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<uint32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads, is_print);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2_approx = S2_approx(x, pi_y, p2, s1);
  int64_t s2 = S2(x, y, z, c, s2_approx, primes, lpf, mu, threads, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}